

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::InputLess<tcu::Vector<float,_4>_>::operator()
          (InputLess<tcu::Vector<float,_4>_> *this,Vector<float,_4> *vec1,Vector<float,_4> *vec2)

{
  bool bVar1;
  ulong uVar2;
  byte bVar3;
  
  bVar1 = true;
  uVar2 = 0;
  do {
    bVar3 = 1;
    if ((vec1->m_data[uVar2] < vec2->m_data[uVar2]) ||
       (bVar3 = 0, vec2->m_data[uVar2] < vec1->m_data[uVar2])) break;
    bVar3 = 0;
    bVar1 = uVar2 < 3;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 4);
  return (bool)(bVar1 & bVar3);
}

Assistant:

bool operator() (const Vector<T, Size>& vec1, const Vector<T, Size>& vec2) const
	{
		for (int ndx = 0; ndx < Size; ++ndx)
		{
			if (inputLess(vec1[ndx], vec2[ndx]))
				return true;
			if (inputLess(vec2[ndx], vec1[ndx]))
				return false;
		}

		return false;
	}